

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O1

archive * archive_write_new(void)

{
  archive *__s;
  char *__s_00;
  
  __s = (archive *)malloc(0x118);
  if (__s != (archive *)0x0) {
    memset(__s,0,0x118);
    __s->magic = 0xb0c5c0de;
    __s->state = 1;
    if (archive_write_vtable_inited == '\0') {
      archive_write_vtable_av._0_8_ = _archive_write_close;
      archive_write_vtable_av._80_8_ = _archive_filter_bytes;
      archive_write_vtable_av._88_8_ = _archive_filter_code;
      archive_write_vtable_av._96_8_ = _archive_filter_name;
      archive_write_vtable_av._72_8_ = _archive_write_filter_count;
      archive_write_vtable_av._8_8_ = _archive_write_free;
      archive_write_vtable_av._16_8_ = _archive_write_header;
      archive_write_vtable_av._24_8_ = _archive_write_finish_entry;
      archive_write_vtable_av._32_8_ = _archive_write_data;
      archive_write_vtable_inited = '\x01';
    }
    __s->vtable = (archive_vtable_conflict *)archive_write_vtable_av;
    __s[1].error_string.length = 0xffffffff00002800;
    *(undefined8 *)&__s[1].compression_code = 0x400;
    __s_00 = (char *)malloc(0x400);
    if (__s_00 != (char *)0x0) {
      memset(__s_00,0,0x400);
      __s[1].archive_format_name = __s_00;
      return __s;
    }
    free(__s);
  }
  return (archive *)0x0;
}

Assistant:

struct archive *
archive_write_new(void)
{
	struct archive_write *a;
	unsigned char *nulls;

	a = (struct archive_write *)malloc(sizeof(*a));
	if (a == NULL)
		return (NULL);
	memset(a, 0, sizeof(*a));
	a->archive.magic = ARCHIVE_WRITE_MAGIC;
	a->archive.state = ARCHIVE_STATE_NEW;
	a->archive.vtable = archive_write_vtable();
	/*
	 * The value 10240 here matches the traditional tar default,
	 * but is otherwise arbitrary.
	 * TODO: Set the default block size from the format selected.
	 */
	a->bytes_per_block = 10240;
	a->bytes_in_last_block = -1;	/* Default */

	/* Initialize a block of nulls for padding purposes. */
	a->null_length = 1024;
	nulls = (unsigned char *)malloc(a->null_length);
	if (nulls == NULL) {
		free(a);
		return (NULL);
	}
	memset(nulls, 0, a->null_length);
	a->nulls = nulls;
	return (&a->archive);
}